

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O0

void __thiscall wasm::SSAify::createNewIndexes(SSAify *this,LocalGraph *graph)

{
  LocalSet *set_00;
  bool bVar1;
  Index IVar2;
  reference ppLVar3;
  Type type;
  LocalSet *set;
  iterator __end2;
  iterator __begin2;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *__range2;
  FindAll<wasm::LocalSet> sets;
  LocalGraph *graph_local;
  SSAify *this_local;
  
  sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)graph;
  FindAll<wasm::LocalSet>::FindAll((FindAll<wasm::LocalSet> *)&__range2,this->func->body);
  __end2 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::begin
                     ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)&__range2);
  set = (LocalSet *)
        std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::end
                  ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)&__range2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                                     *)&set), bVar1) {
    ppLVar3 = __gnu_cxx::
              __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
              ::operator*(&__end2);
    set_00 = *ppLVar3;
    bVar1 = LocalGraph::isSSA((LocalGraph *)
                              sets.list.
                              super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,set_00->index);
    if ((!bVar1) &&
       (((this->allowMerges & 1U) != 0 ||
        (bVar1 = hasMerges(this,set_00,
                           (LocalGraph *)
                           sets.list.
                           super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage), !bVar1)))) {
      type = Function::getLocalType(this->func,set_00->index);
      IVar2 = addLocal(this,type);
      set_00->index = IVar2;
    }
    __gnu_cxx::
    __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
    ::operator++(&__end2);
  }
  FindAll<wasm::LocalSet>::~FindAll((FindAll<wasm::LocalSet> *)&__range2);
  return;
}

Assistant:

void createNewIndexes(LocalGraph& graph) {
    FindAll<LocalSet> sets(func->body);
    for (auto* set : sets.list) {
      // Indexes already in SSA form do not need to be modified - there is
      // already just one set for that index. Otherwise, use a new index, unless
      // merges are disallowed.
      if (!graph.isSSA(set->index) && (allowMerges || !hasMerges(set, graph))) {
        set->index = addLocal(func->getLocalType(set->index));
      }
    }
  }